

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilterBlur.cpp
# Opt level: O2

SharedPtr<Filter> __thiscall
Rml::FilterBlurInstancer::InstanceFilter
          (FilterBlurInstancer *this,String *param_1,PropertyDictionary *properties)

{
  Property *this_00;
  NumericValue NVar1;
  PropertyDictionary *in_RCX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  SharedPtr<Filter> SVar3;
  SharedPtr<Rml::FilterBlur> decorator;
  _func_int **local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_20;
  
  this_00 = PropertyDictionary::GetProperty(in_RCX,param_1[3].field_2._M_local_buf[8]);
  if (this_00 == (Property *)0x0) {
    (this->super_FilterInstancer)._vptr_FilterInstancer = (_func_int **)0x0;
    (this->super_FilterInstancer).super_EffectSpecification.properties.properties.
    super__Vector_base<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>,_std::allocator<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    _Var2._M_pi = extraout_RDX;
  }
  else {
    ::std::make_shared<Rml::FilterBlur>();
    NVar1 = Property::GetNumericValue(this_00);
    _Var2._M_pi = _Stack_20._M_pi;
    *(NumericValue *)(local_28 + 1) = NVar1;
    if (((ulong)NVar1 >> 0x20 & 0x3fbc0) == 0) {
      (this->super_FilterInstancer)._vptr_FilterInstancer = (_func_int **)0x0;
      (this->super_FilterInstancer).super_EffectSpecification.properties.properties.
      super__Vector_base<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>,_std::allocator<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    }
    else {
      _Stack_20._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      (this->super_FilterInstancer)._vptr_FilterInstancer = local_28;
      (this->super_FilterInstancer).super_EffectSpecification.properties.properties.
      super__Vector_base<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>,_std::allocator<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)_Var2._M_pi;
    }
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_20);
    _Var2._M_pi = extraout_RDX_00;
  }
  SVar3.super___shared_ptr<Rml::Filter,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var2._M_pi;
  SVar3.super___shared_ptr<Rml::Filter,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (SharedPtr<Filter>)SVar3.super___shared_ptr<Rml::Filter,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

SharedPtr<Filter> FilterBlurInstancer::InstanceFilter(const String& /*name*/, const PropertyDictionary& properties)
{
	const Property* p_radius = properties.GetProperty(ids.sigma);
	if (!p_radius)
		return nullptr;

	auto decorator = MakeShared<FilterBlur>();
	if (decorator->Initialise(p_radius->GetNumericValue()))
		return decorator;

	return nullptr;
}